

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.hpp
# Opt level: O1

bool __thiscall
gl3cts::ClipDistance::Utility::VertexBufferObject<float>::useAsShaderInput
          (VertexBufferObject<float> *this,Program *program,string *input_attribute_name,
          GLint number_of_components)

{
  GLuint GVar1;
  GLenum GVar2;
  socklen_t __len;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  iterator __position;
  GLint location;
  GLuint local_1c;
  
  GVar1 = (program->m_program_status).program_id;
  if (GVar1 != 0) {
    local_1c = (*this->m_gl->getAttribLocation)(GVar1,(input_attribute_name->_M_dataplus)._M_p);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glGetAttribLocation call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                    ,0x194);
    GVar1 = local_1c;
    if (-1 < (int)local_1c) {
      (*this->m_gl->enableVertexAttribArray)(local_1c);
      GVar2 = (*this->m_gl->getError)();
      __len = 0x19d;
      glu::checkError(GVar2,"glEnableVertexAttribArray call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                      ,0x19d);
      __position._M_current =
           (this->m_enabled_arrays).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_enabled_arrays).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_enabled_arrays,__position,
                   (int *)&local_1c);
        __addr = extraout_RDX_00;
      }
      else {
        *__position._M_current = local_1c;
        __position._M_current = __position._M_current + 1;
        (this->m_enabled_arrays).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current;
        __addr = extraout_RDX;
      }
      bind(this,(int)__position._M_current,__addr,__len);
      (*this->m_gl->vertexAttribPointer)(local_1c,number_of_components,0x1406,'\0',0,(void *)0x0);
      GVar2 = (*this->m_gl->getError)();
      glu::checkError(GVar2,"glVertexAttribPointer call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                      ,0x1a5);
      if (-1 < (int)GVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool gl3cts::ClipDistance::Utility::VertexBufferObject<T>::useAsShaderInput(Program		program,
																			std::string input_attribute_name,
																			glw::GLint  number_of_components)
{
	if (program.ProgramStatus().program_id)
	{
		glw::GLint location = m_gl.getAttribLocation(program.ProgramStatus().program_id, input_attribute_name.c_str());
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetAttribLocation call failed.");

		if (location >= 0)
		{
			const std::type_info& buffer_type = typeid(T);
			const std::type_info& float_type  = typeid(glw::GLfloat);
			const std::type_info& int_type	= typeid(glw::GLint);

			m_gl.enableVertexAttribArray(location);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glEnableVertexAttribArray call failed.");
			m_enabled_arrays.push_back(location);

			bind();

			if (buffer_type == float_type)
			{
				m_gl.vertexAttribPointer(location, number_of_components, GL_FLOAT, false, 0, NULL);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glVertexAttribPointer call failed.");
			}
			else if (buffer_type == int_type)
			{
				m_gl.vertexAttribIPointer(location, number_of_components, GL_FLOAT, 0, NULL);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glVertexAttribIPointer call failed.");
			}
			else
			{
				return false;
			}

			return true;
		}
	}

	return false;
}